

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

stbi_uc * stbi__gif_load_next(stbi__context *s,stbi__gif *g,int *comp,int req_comp,stbi_uc *two_back
                             )

{
  stbi_uc *psVar1;
  bool bVar2;
  char *pcVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  stbi_uc sVar7;
  byte bVar8;
  byte bVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  stbi_uc *__s;
  stbi_uc *__s_00;
  stbi_uc *psVar16;
  undefined4 in_register_0000000c;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  uint n;
  uint uVar22;
  uint uVar23;
  stbi_uc (*pal) [4];
  uint uVar24;
  size_t __size;
  uint uVar25;
  size_t __size_00;
  
  psVar1 = g->out;
  if (psVar1 == (stbi_uc *)0x0) {
    iVar11 = stbi__gif_header(s,g,comp,0);
    if (iVar11 == 0) {
      return (stbi_uc *)0x0;
    }
    iVar11 = g->w;
    iVar12 = g->h;
    iVar13 = stbi__mad3sizes_valid(4,iVar11,iVar12,0);
    if (iVar13 == 0) {
      stbi__g_failure_reason = "too large";
      return (stbi_uc *)0x0;
    }
    iVar12 = iVar12 * iVar11;
    __size = (size_t)(iVar12 * 4);
    __s = (stbi_uc *)malloc(__size);
    g->out = __s;
    __s_00 = (stbi_uc *)malloc(__size);
    g->background = __s_00;
    __size_00 = (size_t)iVar12;
    psVar16 = (stbi_uc *)malloc(__size_00);
    g->history = psVar16;
    if (__s == (stbi_uc *)0x0) {
      stbi__g_failure_reason = "outofmem";
      return (stbi_uc *)0x0;
    }
    if (psVar16 == (stbi_uc *)0x0 || __s_00 == (stbi_uc *)0x0) {
      stbi__g_failure_reason = "outofmem";
      return (stbi_uc *)0x0;
    }
    memset(__s,0,__size);
    memset(__s_00,0,__size);
    memset(psVar16,0,__size_00);
  }
  else {
    uVar22 = (uint)g->eflags >> 2 & 7;
    uVar10 = g->h * g->w;
    uVar25 = uVar22;
    if (uVar22 == 3) {
      uVar25 = 2;
    }
    if (CONCAT44(in_register_0000000c,req_comp) != 0) {
      uVar25 = uVar22;
    }
    if (uVar25 == 3) {
      uVar17 = 0;
      uVar18 = (ulong)uVar10;
      if ((int)uVar10 < 1) {
        uVar18 = uVar17;
      }
      for (; uVar18 != uVar17; uVar17 = uVar17 + 1) {
        if (g->history[uVar17] != '\0') {
          *(undefined4 *)(g->out + uVar17 * 4) =
               *(undefined4 *)(CONCAT44(in_register_0000000c,req_comp) + uVar17 * 4);
        }
      }
    }
    else if (uVar25 == 2) {
      uVar17 = 0;
      uVar18 = (ulong)uVar10;
      if ((int)uVar10 < 1) {
        uVar18 = uVar17;
      }
      for (; uVar18 != uVar17; uVar17 = uVar17 + 1) {
        if (g->history[uVar17] != '\0') {
          *(undefined4 *)(g->out + uVar17 * 4) = *(undefined4 *)(g->background + uVar17 * 4);
        }
      }
    }
    memcpy(g->background,g->out,(long)g->h * (long)g->w * 4);
    psVar16 = g->history;
    __size_00 = (long)g->h * (long)g->w;
  }
  memset(psVar16,0,__size_00);
  pal = g->pal;
  while (sVar7 = stbi__get8(s), sVar7 == '!') {
    sVar7 = stbi__get8(s);
    if (sVar7 == 0xf9) {
      bVar8 = stbi__get8(s);
      if (bVar8 == 4) {
        bVar8 = stbi__get8(s);
        g->eflags = (uint)bVar8;
        iVar11 = stbi__get16le(s);
        g->delay = iVar11 * 10;
        if (-1 < (long)g->transparent) {
          g->pal[g->transparent][3] = 0xff;
        }
        if ((g->eflags & 1) == 0) {
          stbi__skip(s,1);
          g->transparent = -1;
        }
        else {
          bVar8 = stbi__get8(s);
          g->transparent = (uint)bVar8;
          g->pal[bVar8][3] = '\0';
        }
        goto LAB_001663d9;
      }
      stbi__skip(s,(uint)bVar8);
    }
    else {
LAB_001663d9:
      while (bVar8 = stbi__get8(s), bVar8 != 0) {
        stbi__skip(s,(uint)bVar8);
      }
    }
  }
  if (sVar7 == ';') {
    return (stbi_uc *)s;
  }
  if (sVar7 == ',') {
    iVar11 = stbi__get16le(s);
    iVar12 = stbi__get16le(s);
    iVar13 = stbi__get16le(s);
    iVar14 = stbi__get16le(s);
    pcVar3 = "bad Image Descriptor";
    if ((iVar13 + iVar11 <= g->w) && (iVar14 + iVar12 <= g->h)) {
      iVar19 = g->w * 4;
      g->line_size = iVar19;
      g->start_x = iVar11 << 2;
      g->start_y = iVar12 * iVar19;
      g->max_x = (iVar13 + iVar11) * 4;
      iVar14 = iVar19 * (iVar14 + iVar12);
      g->max_y = iVar14;
      g->cur_x = iVar11 << 2;
      if (iVar13 != 0) {
        iVar14 = iVar12 * iVar19;
      }
      g->cur_y = iVar14;
      bVar8 = stbi__get8(s);
      g->lflags = (uint)bVar8;
      iVar11 = g->line_size * 8;
      if ((bVar8 & 0x40) == 0) {
        iVar11 = g->line_size;
      }
      g->step = iVar11;
      g->parse = (int)((uint)bVar8 << 0x19) >> 0x1f & 3;
      if ((char)bVar8 < '\0') {
        pal = g->lpal;
        if ((g->eflags & 1) == 0) {
          iVar11 = -1;
        }
        else {
          iVar11 = g->transparent;
        }
        stbi__gif_parse_colortable(s,pal,2 << (bVar8 & 7),iVar11);
      }
      else if ((g->flags & 0x80) == 0) {
        stbi__g_failure_reason = "missing color table";
        return (stbi_uc *)0x0;
      }
      g->color_table = *pal;
      bVar8 = stbi__get8(s);
      pcVar3 = stbi__g_failure_reason;
      if (bVar8 < 0xd) {
        uVar25 = 1 << (bVar8 & 0x1f);
        for (uVar18 = 0; uVar25 != uVar18; uVar18 = uVar18 + 1) {
          g->codes[uVar18].prefix = -1;
          g->codes[uVar18].first = (stbi_uc)uVar18;
          g->codes[uVar18].suffix = (stbi_uc)uVar18;
        }
        uVar21 = (2 << (bVar8 & 0x1f)) - 1;
        n = 0;
        uVar22 = 0 << (bVar8 & 0x1f);
        iVar12 = 0;
        bVar4 = false;
        uVar5 = 0xffffffff;
        uVar6 = uVar25 + 2;
        iVar11 = bVar8 + 1;
        uVar10 = uVar21;
        while( true ) {
          do {
            for (; uVar15 = uVar10, iVar13 = iVar11, uVar20 = uVar6, uVar23 = uVar5, bVar2 = bVar4,
                iVar11 = iVar12 - iVar13, iVar12 < iVar13; iVar12 = iVar12 + 8) {
              if (n == 0) {
                bVar9 = stbi__get8(s);
                if (bVar9 == 0) goto LAB_0016673f;
                n = (uint)bVar9;
              }
              n = n - 1;
              bVar9 = stbi__get8(s);
              uVar22 = uVar22 | (uint)bVar9 << ((byte)iVar12 & 0x1f);
              bVar4 = bVar2;
              uVar5 = uVar23;
              uVar6 = uVar20;
              iVar11 = iVar13;
              uVar10 = uVar15;
            }
            uVar10 = (int)uVar22 >> ((byte)iVar13 & 0x1f);
            uVar24 = uVar22 & uVar15;
            uVar22 = uVar10;
            iVar12 = iVar11;
            bVar4 = true;
            uVar5 = 0xffffffff;
            uVar6 = uVar25 + 2;
            iVar11 = bVar8 + 1;
            uVar10 = uVar21;
          } while (uVar24 == uVar25);
          if (uVar24 == uVar25 + 1) break;
          if ((int)uVar20 < (int)uVar24) {
            stbi__g_failure_reason = "illegal code in raster";
            return (stbi_uc *)0x0;
          }
          if (!bVar2) {
            stbi__g_failure_reason = "no clear code";
            return (stbi_uc *)0x0;
          }
          if ((int)uVar23 < 0) {
            if (uVar24 == uVar20) {
              stbi__g_failure_reason = "illegal code in raster";
              return (stbi_uc *)0x0;
            }
          }
          else {
            if (0x1fff < (int)uVar20) {
              stbi__g_failure_reason = "too many codes";
              return (stbi_uc *)0x0;
            }
            g->codes[(int)uVar20].prefix = (stbi__int16)uVar23;
            sVar7 = g->codes[uVar23].first;
            g->codes[(int)uVar20].first = sVar7;
            if (uVar24 != uVar20 + 1) {
              sVar7 = g->codes[(int)uVar24].first;
            }
            g->codes[(int)uVar20].suffix = sVar7;
            uVar20 = uVar20 + 1;
          }
          stbi__out_gif_code(g,(stbi__uint16)uVar24);
          iVar11 = iVar13 + 1;
          uVar10 = ~(-1 << ((byte)iVar11 & 0x1f));
          if (0xfff < (int)uVar20 || (uVar20 & uVar15) != 0) {
            uVar10 = uVar15;
            iVar11 = iVar13;
          }
          bVar4 = true;
          uVar5 = uVar24;
          uVar6 = uVar20;
        }
        do {
          stbi__skip(s,n);
          bVar8 = stbi__get8(s);
          n = (uint)bVar8;
        } while (bVar8 != 0);
LAB_0016673f:
        psVar16 = g->out;
        if (psVar16 == (stbi_uc *)0x0) {
          return (stbi_uc *)0x0;
        }
        if (psVar1 == (stbi_uc *)0x0) {
          if (0 < g->bgindex) {
            uVar25 = g->h * g->w;
            uVar17 = 0;
            uVar18 = (ulong)uVar25;
            if ((int)uVar25 < 1) {
              uVar18 = uVar17;
            }
            for (; uVar18 != uVar17; uVar17 = uVar17 + 1) {
              if (g->history[uVar17] == '\0') {
                g->pal[g->bgindex][3] = 0xff;
                *(stbi_uc (*) [4])(g->out + uVar17 * 4) = g->pal[g->bgindex];
              }
            }
            return psVar16;
          }
          return psVar16;
        }
        return psVar16;
      }
    }
  }
  else {
    pcVar3 = "unknown code";
  }
  stbi__g_failure_reason = pcVar3;
  return (stbi_uc *)0x0;
}

Assistant:

static stbi_uc *stbi__gif_load_next(stbi__context *s, stbi__gif *g, int *comp, int req_comp, stbi_uc *two_back)
{
   int dispose; 
   int first_frame; 
   int pi; 
   int pcount; 
   STBI_NOTUSED(req_comp);

   // on first frame, any non-written pixels get the background colour (non-transparent)
   first_frame = 0; 
   if (g->out == 0) {
      if (!stbi__gif_header(s, g, comp,0)) return 0; // stbi__g_failure_reason set by stbi__gif_header
      if (!stbi__mad3sizes_valid(4, g->w, g->h, 0))
         return stbi__errpuc("too large", "GIF image is too large");
      pcount = g->w * g->h;
      g->out = (stbi_uc *) stbi__malloc(4 * pcount);
      g->background = (stbi_uc *) stbi__malloc(4 * pcount);
      g->history = (stbi_uc *) stbi__malloc(pcount);
      if (!g->out || !g->background || !g->history)
         return stbi__errpuc("outofmem", "Out of memory");

      // image is treated as "transparent" at the start - ie, nothing overwrites the current background; 
      // background colour is only used for pixels that are not rendered first frame, after that "background"
      // color refers to the color that was there the previous frame. 
      memset(g->out, 0x00, 4 * pcount);
      memset(g->background, 0x00, 4 * pcount); // state of the background (starts transparent)
      memset(g->history, 0x00, pcount);        // pixels that were affected previous frame
      first_frame = 1; 
   } else {
      // second frame - how do we dispoase of the previous one?
      dispose = (g->eflags & 0x1C) >> 2; 
      pcount = g->w * g->h; 

      if ((dispose == 3) && (two_back == 0)) {
         dispose = 2; // if I don't have an image to revert back to, default to the old background
      }

      if (dispose == 3) { // use previous graphic
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &two_back[pi * 4], 4 ); 
            }
         }
      } else if (dispose == 2) { 
         // restore what was changed last frame to background before that frame; 
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &g->background[pi * 4], 4 ); 
            }
         }
      } else {
         // This is a non-disposal case eithe way, so just 
         // leave the pixels as is, and they will become the new background
         // 1: do not dispose
         // 0:  not specified.
      }

      // background is what out is after the undoing of the previou frame; 
      memcpy( g->background, g->out, 4 * g->w * g->h ); 
   }

   // clear my history; 
   memset( g->history, 0x00, g->w * g->h );        // pixels that were affected previous frame

   for (;;) {
      int tag = stbi__get8(s); 
      switch (tag) {
         case 0x2C: /* Image Descriptor */
         {
            stbi__int32 x, y, w, h;
            stbi_uc *o;

            x = stbi__get16le(s);
            y = stbi__get16le(s);
            w = stbi__get16le(s);
            h = stbi__get16le(s);
            if (((x + w) > (g->w)) || ((y + h) > (g->h)))
               return stbi__errpuc("bad Image Descriptor", "Corrupt GIF");

            g->line_size = g->w * 4;
            g->start_x = x * 4;
            g->start_y = y * g->line_size;
            g->max_x   = g->start_x + w * 4;
            g->max_y   = g->start_y + h * g->line_size;
            g->cur_x   = g->start_x;
            g->cur_y   = g->start_y;

            // if the width of the specified rectangle is 0, that means
            // we may not see *any* pixels or the image is malformed;
            // to make sure this is caught, move the current y down to
            // max_y (which is what out_gif_code checks).
            if (w == 0)
               g->cur_y = g->max_y;

            g->lflags = stbi__get8(s);

            if (g->lflags & 0x40) {
               g->step = 8 * g->line_size; // first interlaced spacing
               g->parse = 3;
            } else {
               g->step = g->line_size;
               g->parse = 0;
            }

            if (g->lflags & 0x80) {
               stbi__gif_parse_colortable(s,g->lpal, 2 << (g->lflags & 7), g->eflags & 0x01 ? g->transparent : -1);
               g->color_table = (stbi_uc *) g->lpal;
            } else if (g->flags & 0x80) {
               g->color_table = (stbi_uc *) g->pal;
            } else
               return stbi__errpuc("missing color table", "Corrupt GIF");            
            
            o = stbi__process_gif_raster(s, g);
            if (!o) return NULL;

            // if this was the first frame, 
            pcount = g->w * g->h; 
            if (first_frame && (g->bgindex > 0)) {
               // if first frame, any pixel not drawn to gets the background color
               for (pi = 0; pi < pcount; ++pi) {
                  if (g->history[pi] == 0) {
                     g->pal[g->bgindex][3] = 255; // just in case it was made transparent, undo that; It will be reset next frame if need be; 
                     memcpy( &g->out[pi * 4], &g->pal[g->bgindex], 4 ); 
                  }
               }
            }

            return o;
         }

         case 0x21: // Comment Extension.
         {
            int len;
            int ext = stbi__get8(s); 
            if (ext == 0xF9) { // Graphic Control Extension.
               len = stbi__get8(s);
               if (len == 4) {
                  g->eflags = stbi__get8(s);
                  g->delay = 10 * stbi__get16le(s); // delay - 1/100th of a second, saving as 1/1000ths.

                  // unset old transparent
                  if (g->transparent >= 0) {
                     g->pal[g->transparent][3] = 255; 
                  } 
                  if (g->eflags & 0x01) {
                     g->transparent = stbi__get8(s);
                     if (g->transparent >= 0) {
                        g->pal[g->transparent][3] = 0; 
                     }
                  } else {
                     // don't need transparent
                     stbi__skip(s, 1); 
                     g->transparent = -1; 
                  }
               } else {
                  stbi__skip(s, len);
                  break;
               }
            } 
            while ((len = stbi__get8(s)) != 0) {
               stbi__skip(s, len);
            }
            break;
         }

         case 0x3B: // gif stream termination code
            return (stbi_uc *) s; // using '1' causes warning on some compilers

         default:
            return stbi__errpuc("unknown code", "Corrupt GIF");
      }
   }
}